

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall ThreadTask::~ThreadTask(ThreadTask *this)

{
  std::condition_variable::notify_all();
  std::thread::join();
  std::condition_variable::~condition_variable(&this->_condition);
  std::deque<Task,_std::allocator<Task>_>::~deque(&(this->_taskQueue).c);
  if ((this->_thread)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

~ThreadTask()
	{
		this->_condition.notify_all();
		this->_thread.join();
	}